

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeSIMDExtract<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          SIMDExtractOp op,size_t param_4)

{
  optional<unsigned_char> oVar1;
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  oVar1 = ParseInput::takeU8(&ctx->in);
  if (((ushort)oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected lane index",&local_21);
    ParseInput::err(&local_48,&ctx->in,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
               __return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT>
makeSIMDExtract(Ctx& ctx, Index pos, SIMDExtractOp op, size_t) {
  auto lane = ctx.in.takeU8();
  if (!lane) {
    return ctx.in.err("expected lane index");
  }
  return ctx.makeSIMDExtract(pos, op, *lane);
}